

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JwtStrategy.cpp
# Opt level: O2

Url * __thiscall
Vault::JwtStrategy::getUrl(Url *__return_storage_ptr__,JwtStrategy *this,Client *client,Path *path)

{
  string local_40;
  
  Vault::operator+(&local_40,"/v1/auth/",&this->mount_);
  (*client->_vptr_Client[3])(__return_storage_ptr__,client,&local_40,path);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::JwtStrategy::getUrl(const Vault::Client &client,
                                      const Vault::Path &path) {
  return client.getUrl("/v1/auth/" + mount_, path);
}